

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModel.cpp
# Opt level: O2

void __thiscall
chrono::collision::ChCollisionModel::SetAllShapesMaterial
          (ChCollisionModel *this,shared_ptr<chrono::ChMaterialSurface> *mat)

{
  int iVar1;
  int iVar2;
  __shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  shared_ptr<chrono::collision::ChCollisionShape> shape;
  __shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  p_Var3 = &((this->m_shapes).
             super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>;
  p_Var4 = &((this->m_shapes).
             super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>;
  if ((int)((ulong)((long)p_Var3 - (long)p_Var4) >> 4) != 0) {
    iVar1 = (**(code **)(*(long *)(((__shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>
                                     *)&p_Var4->_M_ptr)->_M_ptr->m_material).
                                  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x18))();
    iVar2 = (*((mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->_vptr_ChMaterialSurface[3])();
    if (iVar1 != iVar2) {
      __assert_fail("GetNumShapes() == 0 || m_shapes[0]->m_material->GetContactMethod() == mat->GetContactMethod()"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionModel.cpp"
                    ,0xa4,
                    "void chrono::collision::ChCollisionModel::SetAllShapesMaterial(std::shared_ptr<ChMaterialSurface>)"
                   );
    }
    p_Var4 = &((this->m_shapes).
               super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>;
    p_Var3 = &((this->m_shapes).
               super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>;
  }
  for (; p_Var4 != p_Var3; p_Var4 = p_Var4 + 1) {
    std::__shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,p_Var4);
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((local_40._M_ptr)->m_material).
                super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>,
               &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  return;
}

Assistant:

void ChCollisionModel::SetAllShapesMaterial(std::shared_ptr<ChMaterialSurface> mat) {
    assert(GetNumShapes() == 0 || m_shapes[0]->m_material->GetContactMethod() == mat->GetContactMethod());
    for (auto shape : m_shapes)
        shape->m_material = mat;
}